

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.h
# Opt level: O3

bool bsplib::read_env<int>(char *str,int *result)

{
  byte bVar1;
  char *__s;
  size_t sVar2;
  istringstream s;
  long *local_1b8 [2];
  long local_1a8 [2];
  long local_198 [4];
  byte abStack_178 [88];
  ios_base local_120 [264];
  
  __s = getenv(str);
  if (__s != (char *)0x0) {
    local_1b8[0] = local_1a8;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,__s,__s + sVar2);
    std::__cxx11::istringstream::istringstream((istringstream *)local_198,(string *)local_1b8,_S_in)
    ;
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0],local_1a8[0] + 1);
    }
    std::istream::operator>>((istream *)local_198,result);
    bVar1 = abStack_178[*(long *)(local_198[0] + -0x18)];
    std::__cxx11::istringstream::~istringstream((istringstream *)local_198);
    std::ios_base::~ios_base(local_120);
    if ((bVar1 & 5) != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool read_env( const char * str, T & result ) {
#if HAS_DUPENV_S_WIN32
        char * env = NULL;
        if (_dupenv_s( &env, NULL , str) )
            return false;
#else
        const char * env = std::getenv( str );
#endif
        if (env) {
            std::istringstream s( env );
#if HAS_DUPENV_S_WIN32
            free(env);
#endif
            s >> result;
            if (!s)
                return true;
        }
        return false;
    }